

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_split.c
# Opt level: O3

REF_STATUS
ref_split_edge_tet_quality
          (REF_GRID ref_grid,REF_INT node0,REF_INT node1,REF_INT new_node,REF_BOOL *allowed)

{
  REF_INT cell;
  int iVar1;
  REF_NODE ref_node;
  REF_CELL ref_cell;
  REF_ADJ pRVar2;
  REF_ADJ_ITEM pRVar3;
  REF_INT RVar4;
  uint uVar5;
  ulong uVar6;
  ulong uVar7;
  undefined8 uVar8;
  int iVar9;
  long lVar10;
  char *pcVar11;
  long lVar12;
  double dVar13;
  REF_DBL volume1;
  REF_DBL volume0;
  REF_DBL quality1;
  REF_DBL quality0;
  REF_DBL quality;
  REF_INT nodes [27];
  double local_f8;
  int local_f0;
  int local_e0;
  double local_d0;
  double local_c8;
  double local_c0;
  double local_b8;
  double local_b0;
  REF_INT local_a8 [30];
  
  ref_node = ref_grid->node;
  ref_cell = ref_grid->cell[8];
  *allowed = 0;
  if (-1 < node0) {
    pRVar2 = ref_cell->ref_adj;
    local_f8 = 1.0;
    if ((node0 < pRVar2->nnode) && (lVar10 = (long)pRVar2->first[(uint)node0], lVar10 != -1)) {
      pRVar3 = pRVar2->item + lVar10;
      RVar4 = ref_cell->node_per;
      local_f8 = 1.0;
      while( true ) {
        if (0 < RVar4) {
          iVar9 = pRVar3->ref;
          lVar12 = 0;
          do {
            if (ref_cell->c2n[(long)ref_cell->size_per * (long)iVar9 + lVar12] == node1) {
              uVar5 = ref_cell_nodes(ref_cell,iVar9,local_a8);
              if (uVar5 != 0) {
                pcVar11 = "cell nodes";
                uVar8 = 0x252;
                goto LAB_001deb6a;
              }
              uVar5 = ref_node_tet_quality(ref_node,local_a8,&local_b0);
              if (uVar5 != 0) {
                pcVar11 = "q";
                uVar8 = 0x254;
                goto LAB_001deb6a;
              }
              if (local_b0 <= local_f8) {
                local_f8 = local_b0;
              }
              RVar4 = ref_cell->node_per;
            }
            lVar12 = lVar12 + 1;
          } while ((int)lVar12 < RVar4);
        }
        pRVar3 = ref_cell->ref_adj->item;
        local_f0 = (int)lVar10;
        lVar10 = (long)pRVar3[local_f0].next;
        if (lVar10 == -1) break;
        pRVar3 = pRVar3 + lVar10;
      }
      if (node0 < 0) goto LAB_001ded86;
    }
    pRVar2 = ref_cell->ref_adj;
    if ((node0 < pRVar2->nnode) && (lVar10 = (long)pRVar2->first[(uint)node0], lVar10 != -1)) {
      pRVar3 = pRVar2->item + lVar10;
      RVar4 = ref_cell->node_per;
      do {
        if (0 < RVar4) {
          cell = pRVar3->ref;
          iVar9 = 0;
          do {
            if (ref_cell->c2n[ref_cell->size_per * cell + iVar9] == node1) {
              uVar5 = ref_cell_nodes(ref_cell,cell,local_a8);
              if (uVar5 != 0) {
                pcVar11 = "cell nodes";
                uVar8 = 0x259;
LAB_001deb6a:
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_split.c"
                       ,uVar8,"ref_split_edge_tet_quality",(ulong)uVar5,pcVar11);
                return uVar5;
              }
              iVar1 = ref_cell->node_per;
              if (0 < (long)iVar1) {
                uVar6 = 0;
                do {
                  if (local_a8[uVar6] == node0) {
                    local_a8[uVar6] = new_node;
                  }
                  uVar6 = uVar6 + 1;
                } while (uVar6 < (ulong)(long)iVar1);
              }
              uVar5 = ref_node_tet_quality(ref_node,local_a8,&local_b8);
              if (uVar5 != 0) {
                pcVar11 = "q0";
                uVar8 = 0x25d;
                goto LAB_001deb6a;
              }
              uVar5 = ref_node_tet_vol(ref_node,local_a8,&local_c8);
              if (uVar5 != 0) {
                pcVar11 = "vol0";
                uVar8 = 0x25e;
                goto LAB_001deb6a;
              }
              iVar1 = ref_cell->node_per;
              uVar6 = (ulong)iVar1;
              if (0 < (long)uVar6) {
                uVar7 = 0;
                do {
                  if (local_a8[uVar7] == new_node) {
                    local_a8[uVar7] = node0;
                  }
                  uVar7 = uVar7 + 1;
                } while (uVar7 < uVar6);
                if (0 < iVar1) {
                  uVar7 = 0;
                  do {
                    if (local_a8[uVar7] == node1) {
                      local_a8[uVar7] = new_node;
                    }
                    uVar7 = uVar7 + 1;
                  } while (uVar7 < uVar6);
                }
              }
              uVar5 = ref_node_tet_quality(ref_node,local_a8,&local_c0);
              if (uVar5 != 0) {
                pcVar11 = "q1";
                uVar8 = 0x266;
                goto LAB_001deb6a;
              }
              uVar5 = ref_node_tet_vol(ref_node,local_a8,&local_d0);
              if (uVar5 != 0) {
                pcVar11 = "vol1";
                uVar8 = 0x267;
                goto LAB_001deb6a;
              }
              dVar13 = ref_grid->adapt->split_quality_absolute;
              if ((((local_b8 < dVar13) || (local_c0 < dVar13)) ||
                  (dVar13 = ref_grid->adapt->split_quality_relative * local_f8, local_b8 < dVar13))
                 || (((local_c0 < dVar13 || (local_c8 < ref_node->min_volume)) ||
                     (local_d0 < ref_node->min_volume)))) {
                *allowed = 0;
                return 0;
              }
              RVar4 = ref_cell->node_per;
            }
            iVar9 = iVar9 + 1;
          } while (iVar9 < RVar4);
        }
        pRVar3 = ref_cell->ref_adj->item;
        local_e0 = (int)lVar10;
        lVar10 = (long)pRVar3[local_e0].next;
        if (lVar10 == -1) break;
        pRVar3 = pRVar3 + lVar10;
      } while( true );
    }
  }
LAB_001ded86:
  *allowed = 1;
  return 0;
}

Assistant:

REF_FCN REF_STATUS ref_split_edge_tet_quality(REF_GRID ref_grid, REF_INT node0,
                                              REF_INT node1, REF_INT new_node,
                                              REF_BOOL *allowed) {
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_CELL ref_cell = ref_grid_tet(ref_grid);
  REF_INT cell, nodes[REF_CELL_MAX_SIZE_PER];
  REF_INT item, cell_node;
  REF_INT node;
  REF_DBL quality, quality0, quality1;
  REF_DBL volume0, volume1;
  REF_DBL min_existing_quality;

  *allowed = REF_FALSE;

  min_existing_quality = 1.0;
  each_ref_cell_having_node2(ref_cell, node0, node1, item, cell_node, cell) {
    RSS(ref_cell_nodes(ref_cell, cell, nodes), "cell nodes");

    RSS(ref_node_tet_quality(ref_node, nodes, &quality), "q");
    min_existing_quality = MIN(min_existing_quality, quality);
  }

  each_ref_cell_having_node2(ref_cell, node0, node1, item, cell_node, cell) {
    RSS(ref_cell_nodes(ref_cell, cell, nodes), "cell nodes");
    for (node = 0; node < ref_cell_node_per(ref_cell); node++) {
      if (node0 == nodes[node]) nodes[node] = new_node;
    }
    RSS(ref_node_tet_quality(ref_node, nodes, &quality0), "q0");
    RSS(ref_node_tet_vol(ref_node, nodes, &volume0), "vol0");

    for (node = 0; node < ref_cell_node_per(ref_cell); node++) {
      if (new_node == nodes[node]) nodes[node] = node0;
    }
    for (node = 0; node < ref_cell_node_per(ref_cell); node++) {
      if (node1 == nodes[node]) nodes[node] = new_node;
    }
    RSS(ref_node_tet_quality(ref_node, nodes, &quality1), "q1");
    RSS(ref_node_tet_vol(ref_node, nodes, &volume1), "vol1");

    if (quality0 < ref_grid_adapt(ref_grid, split_quality_absolute) ||
        quality1 < ref_grid_adapt(ref_grid, split_quality_absolute) ||
        quality0 < ref_grid_adapt(ref_grid, split_quality_relative) *
                       min_existing_quality ||
        quality1 < ref_grid_adapt(ref_grid, split_quality_relative) *
                       min_existing_quality ||
        volume0 < ref_node_min_volume(ref_node) ||
        volume1 < ref_node_min_volume(ref_node)) {
      *allowed = REF_FALSE;
      return REF_SUCCESS;
    }
  }

  *allowed = REF_TRUE;

  return REF_SUCCESS;
}